

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObserverPtr.cpp
# Opt level: O0

void Rml::Detail::ShutdownObserverPtrPool(void)

{
  ObserverPtrData *pOVar1;
  int iVar2;
  
  iVar2 = Pool<Rml::Detail::ObserverPtrBlock>::GetNumAllocatedObjects
                    (&observer_ptr_data->block_pool);
  pOVar1 = observer_ptr_data;
  if (iVar2 == 0) {
    if (observer_ptr_data != (ObserverPtrData *)0x0) {
      ObserverPtrData::~ObserverPtrData(observer_ptr_data);
      operator_delete(pOVar1,0x30);
    }
    observer_ptr_data = (ObserverPtrData *)0x0;
  }
  else {
    observer_ptr_data->is_shutdown = true;
  }
  return;
}

Assistant:

void Detail::ShutdownObserverPtrPool()
{
	if (observer_ptr_data->block_pool.GetNumAllocatedObjects() == 0)
	{
		delete observer_ptr_data;
		observer_ptr_data = nullptr;
	}
	else
	{
		// This pool must outlive all other global variables that derive from EnableObserverPtr. This even includes user
		// variables which we have no control over. So if there are any objects still alive, let the pool garbage
		// collect itself when all references to it are gone. It is somewhat unreasonable to expect that no observer
		// pointers remain, particularly because that means no objects derived from Rml::EventListener can be alive in
		// user space, which can be a hassle to ensure and is otherwise pretty innocent.
		observer_ptr_data->is_shutdown = true;
	}
}